

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningAgent.cpp
# Opt level: O0

Plan * __thiscall
multi_agent_planning::PlanningAgent::computeSingleAgentPlan
          (Plan *__return_storage_ptr__,PlanningAgent *this,Instance instance)

{
  allocator<unsigned_long> *this_00;
  vertices_size_type vVar1;
  iterator iVar2;
  adj_list_edge_property_map<boost::directed_tag,_int,_int_&,_unsigned_long,_multi_agent_planning::Action,_int_multi_agent_planning::Action::*>
  *p_00;
  boost *g;
  undefined1 local_170 [7];
  found_goal fg;
  iterator_property_map<__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>,_boost::vec_adj_list_vertex_id_map<boost::no_property,_unsigned_long>,_float,_float_&>
  local_150;
  unsigned_long *local_138;
  iterator_property_map<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_boost::vec_adj_list_vertex_id_map<boost::no_property,_unsigned_long>,_unsigned_long,_unsigned_long_&>
  local_130;
  undefined1 local_120 [8];
  bgl_named_params<boost::adj_list_edge_property_map<boost::directed_tag,_int,_int_&,_unsigned_long,_multi_agent_planning::Action,_int_multi_agent_planning::Action::*>,_boost::edge_weight_t,_boost::no_property>
  *local_118 [2];
  bgl_named_params<boost::iterator_property_map<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_boost::vec_adj_list_vertex_id_map<boost::no_property,_unsigned_long>,_unsigned_long,_unsigned_long_&>,_boost::vertex_predecessor_t,_boost::bgl_named_params<boost::adj_list_edge_property_map<boost::directed_tag,_int,_int_&,_unsigned_long,_multi_agent_planning::Action,_int_multi_agent_planning::Action::*>,_boost::edge_weight_t,_boost::no_property>_>
  local_108;
  bgl_named_params<boost::iterator_property_map<__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>,_boost::vec_adj_list_vertex_id_map<boost::no_property,_unsigned_long>,_float,_float_&>,_boost::vertex_distance_t,_boost::bgl_named_params<boost::iterator_property_map<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_boost::vec_adj_list_vertex_id_map<boost::no_property,_unsigned_long>,_unsigned_long,_unsigned_long_&>,_boost::vertex_predecessor_t,_boost::bgl_named_params<boost::adj_list_edge_property_map<boost::directed_tag,_int,_int_&,_unsigned_long,_multi_agent_planning::Action,_int_multi_agent_planning::Action::*>,_boost::edge_weight_t,_boost::no_property>_>_>
  local_e8;
  bgl_named_params<multi_agent_planning::astar_goal_visitor<unsigned_long>,_boost::graph_visitor_t,_boost::bgl_named_params<boost::iterator_property_map<__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>,_boost::vec_adj_list_vertex_id_map<boost::no_property,_unsigned_long>,_float,_float_&>,_boost::vertex_distance_t,_boost::bgl_named_params<boost::iterator_property_map<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_boost::vec_adj_list_vertex_id_map<boost::no_property,_unsigned_long>,_unsigned_long,_unsigned_long_&>,_boost::vertex_predecessor_t,_boost::bgl_named_params<boost::adj_list_edge_property_map<boost::directed_tag,_int,_int_&,_unsigned_long,_multi_agent_planning::Action,_int_multi_agent_planning::Action::*>,_boost::edge_weight_t,_boost::no_property>_>_>_>
  local_b8;
  astar_heuristic<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_float>
  local_72;
  allocator<float> local_71;
  undefined1 local_70 [8];
  vector<float,_std::allocator<float>_> d;
  undefined1 local_48 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> p;
  PlanningAgent *this_local;
  Instance instance_local;
  Plan *plan;
  
  p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  Plan::Plan(__return_storage_ptr__);
  vVar1 = boost::
          num_vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>::config>>
                    ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config>_>
                      *)&this->graph);
  this_00 = (allocator<unsigned_long> *)
            ((long)&d.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<unsigned_long>::allocator(this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,vVar1,this_00);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&d.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  vVar1 = boost::
          num_vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>::config>>
                    ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config>_>
                      *)&this->graph);
  std::allocator<float>::allocator(&local_71);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_70,vVar1,&local_71);
  std::allocator<float>::~allocator(&local_71);
  boost::
  astar_heuristic<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_float>
  ::astar_heuristic(&local_72);
  g = (boost *)&this->graph;
  local_120 = (undefined1  [8])
              boost::
              get<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>::config>,int_multi_agent_planning::Action::*>
                        (0,(adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config>_>
                            *)g);
  local_118[0] = boost::
                 weight_map<boost::adj_list_edge_property_map<boost::directed_tag,int,int&,unsigned_long,multi_agent_planning::Action,int_multi_agent_planning::Action::*>>
                           ((bgl_named_params<boost::adj_list_edge_property_map<boost::directed_tag,_int,_int_&,_unsigned_long,_multi_agent_planning::Action,_int_multi_agent_planning::Action::*>,_boost::edge_weight_t,_boost::no_property>
                             *)local_120,g,p_00);
  local_138 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
  boost::
  get<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>::config>,boost::vertex_index_t>
            (vertex_index,
             (adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config>_>
              *)&this->graph);
  local_130.iter._M_current =
       (unsigned_long *)
       boost::
       make_iterator_property_map<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,boost::vec_adj_list_vertex_id_map<boost::no_property,unsigned_long>>
                 (local_138);
  boost::
  bgl_named_params<boost::adj_list_edge_property_map<boost::directed_tag,int,int&,unsigned_long,multi_agent_planning::Action,int_multi_agent_planning::Action::*>,boost::edge_weight_t,boost::no_property>
  ::
  predecessor_map<boost::iterator_property_map<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,boost::vec_adj_list_vertex_id_map<boost::no_property,unsigned_long>,unsigned_long,unsigned_long&>>
            (&local_108,local_118,&local_130);
  iVar2 = std::vector<float,_std::allocator<float>_>::begin
                    ((vector<float,_std::allocator<float>_> *)local_70);
  boost::
  get<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>::config>,boost::vertex_index_t>
            (vertex_index,
             (adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config>_>
              *)&this->graph);
  local_150.iter._M_current =
       (float *)boost::
                make_iterator_property_map<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,boost::vec_adj_list_vertex_id_map<boost::no_property,unsigned_long>>
                          (iVar2._M_current);
  boost::
  bgl_named_params<boost::iterator_property_map<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,boost::vec_adj_list_vertex_id_map<boost::no_property,unsigned_long>,unsigned_long,unsigned_long&>,boost::vertex_predecessor_t,boost::bgl_named_params<boost::adj_list_edge_property_map<boost::directed_tag,int,int&,unsigned_long,multi_agent_planning::Action,int_multi_agent_planning::Action::*>,boost::edge_weight_t,boost::no_property>>
  ::
  distance_map<boost::iterator_property_map<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,boost::vec_adj_list_vertex_id_map<boost::no_property,unsigned_long>,float,float&>>
            (&local_e8,&local_108,&local_150);
  astar_goal_visitor<unsigned_long>::astar_goal_visitor
            ((astar_goal_visitor<unsigned_long> *)local_170,instance.goal);
  boost::
  bgl_named_params<boost::iterator_property_map<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,boost::vec_adj_list_vertex_id_map<boost::no_property,unsigned_long>,float,float&>,boost::vertex_distance_t,boost::bgl_named_params<boost::iterator_property_map<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,boost::vec_adj_list_vertex_id_map<boost::no_property,unsigned_long>,unsigned_long,unsigned_long&>,boost::vertex_predecessor_t,boost::bgl_named_params<boost::adj_list_edge_property_map<boost::directed_tag,int,int&,unsigned_long,multi_agent_planning::Action,int_multi_agent_planning::Action::*>,boost::edge_weight_t,boost::no_property>>>
  ::visitor<multi_agent_planning::astar_goal_visitor<unsigned_long>>
            (&local_b8,&local_e8,(astar_goal_visitor<unsigned_long> *)local_170);
  boost::
  astar_search<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::astar_heuristic<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,float>,multi_agent_planning::astar_goal_visitor<unsigned_long>,boost::graph_visitor_t,boost::bgl_named_params<boost::iterator_property_map<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,boost::vec_adj_list_vertex_id_map<boost::no_property,unsigned_long>,float,float&>,boost::vertex_distance_t,boost::bgl_named_params<boost::iterator_property_map<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,boost::vec_adj_list_vertex_id_map<boost::no_property,unsigned_long>,unsigned_long,unsigned_long&>,boost::vertex_predecessor_t,boost::bgl_named_params<boost::adj_list_edge_property_map<boost::directed_tag,int,int&,unsigned_long,multi_agent_planning::Action,int_multi_agent_planning::Action::*>,boost::edge_weight_t,boost::no_property>>>>
            (&this->graph,instance.start,&local_b8);
  p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_70);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
  if ((p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    Plan::~Plan(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Plan PlanningAgent::computeSingleAgentPlan(const Instance instance) {

	Plan plan;

	vector<Vertex> p(num_vertices(graph));
	vector<float> d(num_vertices(graph));

	try {
		astar_search(
			graph, instance.start, 
			astar_heuristic<Graph, float>(), 
			weight_map(get(&Action::cost, graph)).
			predecessor_map(make_iterator_property_map(p.begin(), get(vertex_index, graph))).
  	  distance_map(make_iterator_property_map(d.begin(), get(vertex_index, graph))).
  	  visitor(astar_goal_visitor<Vertex>(instance.goal))
  	);
  }
  catch(found_goal fg) {

  	planHelper(instance.goal, p, d, plan);

  }

	return plan;
}